

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O1

void __thiscall r_exec::RMonitor::update(RMonitor *this,uint64_t *next_target)

{
  MDLController *pMVar1;
  int iVar2;
  uint64_t uVar3;
  
  iVar2 = (*((this->super_GMonitor).super__GMonitor.super_Monitor.target.object)->_vptr__Object[0xe]
          )();
  if ((char)iVar2 == '\0') {
    if ((this->super_GMonitor).super__GMonitor.simulating == 0) {
      pMVar1 = (this->super_GMonitor).super__GMonitor.super_Monitor.controller;
      uVar3 = 0;
      (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [0xf])(pMVar1,(this->super_GMonitor).super__GMonitor.super_Monitor.target.object,0,0);
      PMDLController::remove_r_monitor
                ((PMDLController *)(this->super_GMonitor).super__GMonitor.super_Monitor.controller,
                 (_GMonitor *)this);
    }
    else {
      (this->super_GMonitor).super__GMonitor.simulating = 0;
      GMonitor::commit(&this->super_GMonitor);
      uVar3 = (this->super_GMonitor).super__GMonitor.deadline;
    }
  }
  else {
    PMDLController::remove_r_monitor
              ((PMDLController *)(this->super_GMonitor).super__GMonitor.super_Monitor.controller,
               (_GMonitor *)this);
    uVar3 = 0;
  }
  *next_target = uVar3;
  return;
}

Assistant:

void RMonitor::update(uint64_t &next_target)
{
    if (target->is_invalidated()) {
        ((PMDLController *)controller)->remove_r_monitor(this);
        next_target = 0;
    } else if (simulating) {
        simulating = 0;
        commit();
        next_target = deadline;
    } else {
        ((PMDLController *)controller)->register_goal_outcome(target, false, nullptr);
        ((PMDLController *)controller)->remove_r_monitor(this);
        next_target = 0;
    }
}